

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *r_00;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  uint flag;
  int iVar8;
  secp256k1_fe s1;
  secp256k1_fe m;
  secp256k1_fe m_alt;
  secp256k1_fe rr_alt;
  secp256k1_fe rr;
  secp256k1_fe t;
  secp256k1_fe u1;
  secp256k1_fe q;
  secp256k1_fe n;
  secp256k1_fe tt;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe zz;
  
  secp256k1_gej_verify(a);
  secp256k1_ge_verify(b);
  if (b->infinity == 0) {
    psVar1 = &a->z;
    secp256k1_fe_sqr(&zz,psVar1);
    u1.n[0] = (a->x).n[0];
    u1.n[1] = (a->x).n[1];
    u1.n[2] = (a->x).n[2];
    u1.n[3] = (a->x).n[3];
    u1.n[4] = (a->x).n[4];
    u1.magnitude = (a->x).magnitude;
    u1.normalized = (a->x).normalized;
    secp256k1_fe_mul(&u2,&b->x,&zz);
    uVar2 = (a->y).n[0];
    uVar3 = (a->y).n[1];
    uVar4 = (a->y).n[2];
    uVar5 = (a->y).n[3];
    uVar6 = (a->y).n[4];
    uVar7._0_4_ = (a->y).magnitude;
    uVar7._4_4_ = (a->y).normalized;
    secp256k1_fe_mul(&s2,&b->y,&zz);
    secp256k1_fe_mul(&s2,&s2,psVar1);
    t.n[4] = u1.n[4];
    t.magnitude = u1.magnitude;
    t.normalized = u1.normalized;
    t.n[2] = u1.n[2];
    t.n[3] = u1.n[3];
    t.n[0] = u1.n[0];
    t.n[1] = u1.n[1];
    secp256k1_fe_add(&t,&u2);
    m.n[0] = uVar2;
    m.n[1] = uVar3;
    m.n[2] = uVar4;
    m.n[3] = uVar5;
    m.n[4] = uVar6;
    m._40_8_ = uVar7;
    secp256k1_fe_add(&m,&s2);
    secp256k1_fe_sqr(&rr,&t);
    secp256k1_fe_negate_unchecked(&m_alt,&u2,1);
    secp256k1_fe_mul(&tt,&u1,&m_alt);
    secp256k1_fe_add(&rr,&tt);
    flag = secp256k1_fe_normalizes_to_zero(&m);
    rr_alt.n[0] = uVar2;
    rr_alt.n[1] = uVar3;
    rr_alt.n[2] = uVar4;
    rr_alt.n[3] = uVar5;
    rr_alt.n[4] = uVar6;
    rr_alt._40_8_ = uVar7;
    secp256k1_fe_mul_int_unchecked(&rr_alt,2);
    secp256k1_fe_add(&m_alt,&u1);
    secp256k1_fe_cmov(&rr_alt,&rr,flag ^ 1);
    secp256k1_fe_cmov(&m_alt,&m,flag ^ 1);
    secp256k1_fe_sqr(&n,&m_alt);
    secp256k1_fe_negate_unchecked(&q,&t,5);
    secp256k1_fe_mul(&q,&q,&n);
    secp256k1_fe_sqr(&n,&n);
    secp256k1_fe_cmov(&n,&m,flag);
    secp256k1_fe_sqr(&t,&rr_alt);
    r_00 = &r->z;
    secp256k1_fe_mul(r_00,psVar1,&m_alt);
    secp256k1_fe_add(&t,&q);
    (r->x).n[4] = t.n[4];
    (r->x).magnitude = t.magnitude;
    (r->x).normalized = t.normalized;
    (r->x).n[2] = t.n[2];
    (r->x).n[3] = t.n[3];
    (r->x).n[0] = t.n[0];
    (r->x).n[1] = t.n[1];
    secp256k1_fe_mul_int_unchecked(&t,2);
    secp256k1_fe_add(&t,&q);
    secp256k1_fe_mul(&t,&t,&rr_alt);
    secp256k1_fe_add(&t,&n);
    psVar1 = &r->y;
    secp256k1_fe_negate_unchecked(psVar1,&t,6);
    secp256k1_fe_half(psVar1);
    secp256k1_fe_cmov(&r->x,&b->x,a->infinity);
    secp256k1_fe_cmov(psVar1,&b->y,a->infinity);
    secp256k1_fe_cmov(r_00,&secp256k1_fe_one,a->infinity);
    iVar8 = secp256k1_fe_normalizes_to_zero(r_00);
    r->infinity = iVar8;
    secp256k1_gej_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/group_impl.h"
          ,0x2db,"test condition failed: !b->infinity");
  abort();
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 21 add/cmov/half/mul_int/negate/normalizes_to_zero */
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int degenerate;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    VERIFY_CHECK(!b->infinity);

    /*  In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = -T*M^2
     *    R = T^2-U1*U2
     *    X3 = R^2+Q
     *    Y3 = -(R*(2*X3+Q)+M^4)/2
     *    Z3 = M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x;                                          /* u1 = U1 = X1*Z2^2 (GEJ_X_M) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y;                                          /* s1 = S1 = Y1*Z2^3 (GEJ_Y_M) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (GEJ_X_M+1) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 (2) */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (1) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (2) */
    /* If lambda = R/M = R/0 we have a problem (except in the "trivial"
     * case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr_alt = Y1*Z2^3 - Y2*Z1^3 (GEJ_Y_M*2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 (GEJ_X_M+2) */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);       /* rr_alt (GEJ_Y_M*2) */
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);         /* m_alt (GEJ_X_M+2) */
    /* Now Ralt / Malt = lambda and is guaranteed not to be Ralt / 0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_negate(&q, &t,
        SECP256K1_GEJ_X_MAGNITUDE_MAX + 1);             /* q = -T (GEJ_X_M+2) */
    secp256k1_fe_mul(&q, &q, &n);                       /* q = Q = -T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);                           /* n = Malt^4 (1) */
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (GEJ_Y_M+1) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Z3 = Malt*Z (1) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2 + Q (2) */
    r->x = t;                                           /* r->x = X3 = Ralt^2 + Q (2) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*X3 (4) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*X3 + Q (5) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*X3 + Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*X3 + Q) + M^3*Malt (GEJ_Y_M+2) */
    secp256k1_fe_negate(&r->y, &t,
        SECP256K1_GEJ_Y_MAGNITUDE_MAX + 2);             /* r->y = -(Ralt*(2*X3 + Q) + M^3*Malt) (GEJ_Y_M+3) */
    secp256k1_fe_half(&r->y);                           /* r->y = Y3 = -(Ralt*(2*X3 + Q) + M^3*Malt)/2 ((GEJ_Y_M+3)/2 + 1) */

    /* In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &secp256k1_fe_one, a->infinity);

    /* Set r->infinity if r->z is 0.
     *
     * If a->infinity is set, then r->infinity = (r->z == 0) = (1 == 0) = false,
     * which is correct because the function assumes that b is not infinity.
     *
     * Now assume !a->infinity. This implies Z = Z1 != 0.
     *
     * Case y1 = -y2:
     * In this case we could have a = -b, namely if x1 = x2.
     * We have degenerate = true, r->z = (x1 - x2) * Z.
     * Then r->infinity = ((x1 - x2)Z == 0) = (x1 == x2) = (a == -b).
     *
     * Case y1 != -y2:
     * In this case, we can't have a = -b.
     * We have degenerate = false, r->z = (y1 + y2) * Z.
     * Then r->infinity = ((y1 + y2)Z == 0) = (y1 == -y2) = false. */
    r->infinity = secp256k1_fe_normalizes_to_zero(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}